

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int SetUserCVar(int playernum,char *cvarname,int value,bool is_string)

{
  FBaseCVar **ppFVar1;
  FBaseCVar *pFVar2;
  int iVar3;
  int iVar4;
  FName local_34;
  
  iVar3 = 0;
  iVar4 = 0;
  if (((uint)playernum < 8) && (playeringame[(uint)playernum] == true)) {
    FName::NameManager::FindName(&FName::NameData,cvarname,true);
    ppFVar1 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::CheckKey
                        ((TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *
                         )(&DAT_009ba458 + (ulong)(uint)playernum * 0x2a0),&local_34);
    iVar4 = iVar3;
    if ((ppFVar1 != (FBaseCVar **)0x0) &&
       ((pFVar2 = *ppFVar1, pFVar2 != (FBaseCVar *)0x0 && ((pFVar2->Flags & 0x6000) == 0x2000)))) {
      DoSetCVar(pFVar2,value,is_string,false);
      if (consoleplayer == playernum) {
        pFVar2 = FindCVar(cvarname,(FBaseCVar **)0x0);
        iVar4 = 1;
        if (pFVar2 != (FBaseCVar *)0x0) {
          DoSetCVar(pFVar2,value,is_string,true);
        }
      }
      else {
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int SetUserCVar(int playernum, const char *cvarname, int value, bool is_string)
{
	if ((unsigned)playernum >= MAXPLAYERS || !playeringame[playernum])
	{
		return 0;
	}
	FBaseCVar **cvar_p = players[playernum].userinfo.CheckKey(FName(cvarname, true));
	FBaseCVar *cvar;
	// Only mod-created cvars may be set.
	if (cvar_p == NULL || (cvar = *cvar_p) == NULL || (cvar->GetFlags() & CVAR_IGNORE) || !(cvar->GetFlags() & CVAR_MOD))
	{
		return 0;
	}
	DoSetCVar(cvar, value, is_string);

	// If we are this player, then also reflect this change in the local version of this cvar.
	if (playernum == consoleplayer)
	{
		FBaseCVar *cvar = FindCVar(cvarname, NULL);
		// If we can find it in the userinfo, then we should also be able to find it in the normal cvar list,
		// but check just to be safe.
		if (cvar != NULL)
		{
			DoSetCVar(cvar, value, is_string, true);
		}
	}

	return 1;
}